

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grammar.capnp.h
# Opt level: O2

void __thiscall
capnp::compiler::Declaration::Method::Results::Builder::adoptExplicit
          (Builder *this,Orphan<capnp::compiler::Declaration::ParamList> *value)

{
  PointerBuilder local_18;
  
  *(undefined2 *)((long)(this->_builder).data + 0xc) = 1;
  local_18.pointer = (this->_builder).pointers + 6;
  local_18.segment = (this->_builder).segment;
  local_18.capTable = (this->_builder).capTable;
  capnp::_::PointerBuilder::adopt(&local_18,&value->builder);
  return;
}

Assistant:

inline void Declaration::Method::Results::Builder::adoptExplicit(
    ::capnp::Orphan< ::capnp::compiler::Declaration::ParamList>&& value) {
  _builder.setDataField<Declaration::Method::Results::Which>(
      ::capnp::bounded<6>() * ::capnp::ELEMENTS, Declaration::Method::Results::EXPLICIT);
  ::capnp::_::PointerHelpers< ::capnp::compiler::Declaration::ParamList>::adopt(_builder.getPointerField(
      ::capnp::bounded<6>() * ::capnp::POINTERS), kj::mv(value));
}